

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O2

void __thiscall wallet::wallet_crypto_tests::encrypt::test_method(encrypt *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  span<const_unsigned_char,_18446744073709551615UL> plaintext;
  span<const_unsigned_char,_18446744073709551615UL> plaintext_00;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  secure_allocator<char> local_91;
  CCrypter crypt;
  uint256 hash;
  array<unsigned_char,_8UL> salt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  salt._M_elems[0] = '\0';
  salt._M_elems[1] = '\0';
  salt._M_elems[2] = 0xde;
  salt._M_elems[3] = 0xad;
  salt._M_elems[4] = 0xbe;
  salt._M_elems[5] = 0xef;
  salt._M_elems[6] = '\0';
  salt._M_elems[7] = '\0';
  CCrypter::CCrypter(&crypt);
  std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
  basic_string<secure_allocator<char>>
            ((basic_string<char,std::char_traits<char>,secure_allocator<char>> *)&hash,"passphrase",
             &local_91);
  salt_00._M_extent._M_extent_value = 8;
  salt_00._M_ptr = salt._M_elems;
  CCrypter::SetKeyFromPassphrase(&crypt,(SecureString *)&hash,salt_00,25000,0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)&hash);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = 0xfe;
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = 0xb5;
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = 0xf7;
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\x7f';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = 0xf0;
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = 0xd6;
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = 'p';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = 0xf1;
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\x02';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = 0xf6;
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\x19';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = 'h';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = 't';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = 'S';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = 0xb2;
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = 0x9d;
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\"';
  hash.super_base_blob<256U>.m_data._M_elems[1] = 0xbc;
  hash.super_base_blob<256U>.m_data._M_elems[2] = 0xad;
  hash.super_base_blob<256U>.m_data._M_elems[3] = 0xe0;
  hash.super_base_blob<256U>.m_data._M_elems[4] = 0x9a;
  hash.super_base_blob<256U>.m_data._M_elems[5] = 0xc0;
  hash.super_base_blob<256U>.m_data._M_elems[6] = '?';
  hash.super_base_blob<256U>.m_data._M_elems[7] = 0xf6;
  hash.super_base_blob<256U>.m_data._M_elems[8] = '8';
  hash.super_base_blob<256U>.m_data._M_elems[9] = 'i';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\x14';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '5';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = 0x9c;
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = 0xfe;
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = 0x88;
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\\';
  plaintext._M_extent._M_extent_value = 0x20;
  plaintext._M_ptr = (pointer)&hash;
  TestCrypter::TestEncrypt
            (&crypt,plaintext,(span<const_unsigned_char,_18446744073709551615UL>)ZEXT816(0));
  iVar2 = 100;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    GetRandHash();
    plaintext_00._M_extent._M_extent_value = 0x20;
    plaintext_00._M_ptr = (pointer)&hash;
    TestCrypter::TestEncrypt
              (&crypt,plaintext_00,(span<const_unsigned_char,_18446744073709551615UL>)ZEXT816(0));
  }
  CCrypter::~CCrypter(&crypt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(encrypt) {
    constexpr std::array<uint8_t, WALLET_CRYPTO_SALT_SIZE> salt{"0000deadbeef0000"_hex_u8};
    CCrypter crypt;
    crypt.SetKeyFromPassphrase("passphrase", salt, 25000, 0);
    TestCrypter::TestEncrypt(crypt, "22bcade09ac03ff6386914359cfe885cfeb5f77ff0d670f102f619687453b29d"_hex_u8);

    for (int i = 0; i != 100; i++)
    {
        uint256 hash(GetRandHash());
        TestCrypter::TestEncrypt(crypt, std::span<unsigned char>{hash.begin(), hash.end()});
    }

}